

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::clara::detail::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *pvVar1;
  string *optToken;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  TokenStream *pTVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ParserResult result;
  TokenStream remainingTokens;
  Result validationResult;
  undefined1 local_138 [16];
  undefined1 auStack_128 [16];
  undefined1 local_118 [32];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_f8;
  undefined1 local_d8 [40];
  Token local_b0;
  ParseState local_88;
  BasicResult<void> local_58;
  
  (*(this->super_ParserRefImpl<Catch::clara::detail::Opt>).
    super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
            (&local_58);
  if (local_58.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_58);
    goto LAB_00188273;
  }
  local_118._16_8_ = (tokens->it)._M_current;
  local_118._24_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (&local_f8,&tokens->m_tokenBuffer);
  if ((local_f8.
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_f8.
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (local_118._16_8_ == local_118._24_8_)) {
LAB_001881f0:
    pvVar1 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (auStack_128 + 8);
    local_138._0_4_ = 1;
    local_138._8_8_ = local_118._16_8_;
    auStack_128._0_8_ = local_118._24_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              (pvVar1,&local_f8);
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
    super_ResultBase.m_type = Ok;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001e57e0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
    m_value.m_type = local_138._0_4_;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
    m_value.m_remainingTokens.it._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
    m_value.m_remainingTokens.itEnd._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_128._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              (&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
                field_0.m_value.m_remainingTokens.m_tokenBuffer,pvVar1);
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001e5788;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              (pvVar1);
  }
  else {
    if (local_f8.
        super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_f8.
        super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!m_tokenBuffer.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O1/tests/catch2/catch.hpp"
                    ,0x22d7,"const Token *Catch::clara::detail::TokenStream::operator->() const");
    }
    if ((local_f8.
         super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_start)->type != Option) goto LAB_001881f0;
    TokenStream::operator*(&local_b0,(TokenStream *)(local_118 + 0x10));
    optToken = &local_b0.token;
    bVar3 = isMatch(this,optToken);
    if (!bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.token._M_dataplus._M_p != &local_b0.token.field_2) {
        operator_delete(local_b0.token._M_dataplus._M_p);
      }
      goto LAB_001881f0;
    }
    iVar4 = (*((this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar2 = (this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
             super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar4 == '\0') {
      TokenStream::operator++((TokenStream *)(local_118 + 0x10));
      if ((local_f8.
           super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_f8.
           super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish) && (local_118._16_8_ == local_118._24_8_)) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"Expected argument following ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         optToken);
        BasicResult<Catch::clara::detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,(string *)local_138);
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_128;
      }
      else {
        TokenStream::operator*((Token *)local_d8,(TokenStream *)(local_118 + 0x10));
        if (local_d8._0_4_ == Argument) {
          (*peVar2->_vptr_BoundRef[4])(local_138,peVar2,local_d8 + 8);
          if (local_138._8_4_ == Ok) {
            (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
            if (local_138._12_4_ != 2) {
              local_138._0_8_ = &PTR__BasicResult_001e58e8;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  auStack_128._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118) {
                operator_delete((void *)auStack_128._0_8_);
              }
              auStack_128._0_8_ = local_d8._8_8_;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_d8._8_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_d8 + 0x18)) goto LAB_001884bd;
              goto LAB_001884c2;
            }
            (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
            pvVar1 = &local_88.m_remainingTokens.m_tokenBuffer;
            local_88.m_type = local_138._12_4_;
            local_88.m_remainingTokens.it._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._16_8_;
            local_88.m_remainingTokens.itEnd._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_118._24_8_;
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            vector(pvVar1,&local_f8);
            BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                      (__return_storage_ptr__,&local_88);
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(pvVar1);
          }
          else {
            BasicResult<Catch::clara::detail::ParseState>::
            BasicResult<Catch::clara::detail::ParseResultType>
                      (__return_storage_ptr__,
                       (BasicResult<Catch::clara::detail::ParseResultType> *)local_138);
          }
          local_138._0_8_ = &PTR__BasicResult_001e58e8;
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_128._0_8_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_128._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118) {
LAB_00188468:
            operator_delete(pbVar5);
          }
        }
        else {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Expected argument following ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           optToken);
          BasicResult<Catch::clara::detail::ParseState>::BasicResult
                    (__return_storage_ptr__,RuntimeError,(string *)local_138);
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_138._0_8_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_128)
          goto LAB_00188468;
        }
        pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d8 + 0x18);
      }
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pbVar5[-1].field_2._M_allocated_capacity;
      if (pbVar7 != pbVar5) goto LAB_0018847b;
    }
    else {
      (*peVar2->_vptr_BoundRef[4])(local_138,peVar2,1);
      if (local_138._8_4_ == Ok) {
        (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
        if (local_138._12_4_ != 2) {
          local_138._0_8_ = &PTR__BasicResult_001e58e8;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_128._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118) {
LAB_001884bd:
            operator_delete((void *)auStack_128._0_8_);
          }
LAB_001884c2:
          pTVar6 = TokenStream::operator++((TokenStream *)(local_118 + 0x10));
          local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
          local_138._8_8_ = (pTVar6->it)._M_current;
          auStack_128._0_8_ = (pTVar6->itEnd)._M_current;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(auStack_128 + 8),&pTVar6->m_tokenBuffer);
          BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                    (__return_storage_ptr__,(ParseState *)local_138);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)(auStack_128 + 8));
          goto LAB_00188480;
        }
        (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_138._0_8_ + 0x10))->_M_allocated_capacity)();
        pvVar1 = &local_88.m_remainingTokens.m_tokenBuffer;
        local_88.m_type = local_138._12_4_;
        local_88.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._16_8_;
        local_88.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118._24_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(pvVar1,&local_f8);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (__return_storage_ptr__,&local_88);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector(pvVar1);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>
                  (__return_storage_ptr__,
                   (BasicResult<Catch::clara::detail::ParseResultType> *)local_138);
      }
      local_138._0_8_ = &PTR__BasicResult_001e58e8;
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               auStack_128._0_8_;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_128._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118) {
LAB_0018847b:
        operator_delete(pbVar7);
      }
    }
LAB_00188480:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.token._M_dataplus._M_p != &local_b0.token.field_2) {
      operator_delete(local_b0.token._M_dataplus._M_p);
    }
    if (!bVar3) goto LAB_001881f0;
  }
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&local_f8);
LAB_00188273:
  local_58.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001e56f8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_errorMessage._M_dataplus._M_p != &local_58.m_errorMessage.field_2) {
    operator_delete(local_58.m_errorMessage._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            if( remainingTokens && remainingTokens->type == TokenType::Option ) {
                auto const &token = *remainingTokens;
                if( isMatch(token.token ) ) {
                    if( m_ref->isFlag() ) {
                        auto flagRef = static_cast<detail::BoundFlagRefBase*>( m_ref.get() );
                        auto result = flagRef->setFlag( true );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    } else {
                        auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );
                        ++remainingTokens;
                        if( !remainingTokens )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto const &argToken = *remainingTokens;
                        if( argToken.type != TokenType::Argument )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto result = valueRef->setValue( argToken.token );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    }
                    return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
                }
            }
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );
        }